

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::BoxRenderer::Render
          (BoxRenderer *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,ColumnDataCollection *result,BaseResultRenderer *ss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  value_type vVar3;
  pointer puVar4;
  pointer puVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  reference pvVar11;
  InternalException *this_00;
  pointer puVar12;
  idx_t iVar13;
  ulong __val;
  size_type sVar14;
  string *this_01;
  idx_t min_width;
  idx_t c;
  ulong bottom_rows;
  ulong uVar15;
  bool local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string shown_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_count_str;
  list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> collections;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> row_count_str;
  string local_160;
  vector<unsigned_long,_true> widths;
  vector<unsigned_long,_true> column_map;
  _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> local_108;
  vector<duckdb::LogicalType,_true> result_types;
  string local_c8;
  idx_t total_length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  string local_88;
  vector<unsigned_long,_true> boundaries;
  string local_50;
  
  lVar9 = (long)(result->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(result->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar9 / 0x18 !=
      (long)(names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10,context,lVar9 % 0x18);
    ::std::__cxx11::string::string
              ((string *)&row_count_str,"Error in BoxRenderer::Render - unaligned columns and names"
               ,(allocator *)&shown_str);
    InternalException::InternalException(this_00,&row_count_str);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar10 = (this->config).max_width;
  if (uVar10 == 0) {
    bVar8 = Printer::IsTerminal(STREAM_STDOUT);
    if (bVar8) {
      uVar10 = Printer::TerminalWidth();
    }
    else {
      uVar10 = 0x78;
    }
  }
  iVar13 = 0x50;
  if (0x50 < uVar10) {
    iVar13 = uVar10;
  }
  uVar10 = result->count;
  uVar15 = (this->config).max_rows;
  __val = uVar15;
  if (uVar10 < uVar15) {
    __val = uVar10;
  }
  if (uVar10 <= uVar15 + 3) {
    __val = uVar10;
  }
  bottom_rows = 0;
  uVar15 = uVar10;
  if (__val != uVar10) {
    bottom_rows = __val >> 1;
    uVar15 = __val - (__val >> 1);
  }
  ::std::__cxx11::to_string(&shown_str,uVar10);
  ::std::operator+(&row_count_str,&shown_str," rows");
  ::std::__cxx11::string::~string((string *)&shown_str);
  uVar2 = (this->config).limit;
  if (uVar10 == uVar2 && uVar2 != 0) {
    ::std::__cxx11::string::assign((char *)&row_count_str);
  }
  paVar1 = &shown_str.field_2;
  shown_str._M_string_length = 0;
  shown_str.field_2._M_local_buf[0] = '\0';
  local_221 = uVar15 < uVar10;
  shown_str._M_dataplus._M_p = (pointer)paVar1;
  if (local_221) {
    ::std::__cxx11::string::assign((char *)&shown_str);
    if (uVar10 == uVar2 && uVar2 != 0) {
      ::std::__cxx11::to_string(&local_160,(this->config).limit - 1);
      ::std::operator+(&local_200,">",&local_160);
      ::std::operator+(&column_count_str,&local_200," rows, ");
      ::std::__cxx11::string::append((string *)&shown_str);
      ::std::__cxx11::string::~string((string *)&column_count_str);
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::__cxx11::string::~string((string *)&local_160);
    }
    ::std::__cxx11::to_string(&local_200,__val);
    ::std::operator+(&column_count_str,&local_200," shown)");
    ::std::__cxx11::string::append((string *)&shown_str);
    ::std::__cxx11::string::~string((string *)&column_count_str);
    ::std::__cxx11::string::~string((string *)&local_200);
  }
  sVar14 = shown_str._M_string_length;
  if (shown_str._M_string_length < row_count_str._M_string_length) {
    sVar14 = row_count_str._M_string_length;
  }
  FetchRenderCollections_abi_cxx11_(&collections,this,context,result,uVar15,bottom_rows);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&column_names,
           &names->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(result->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  if ((this->config).render_mode == COLUMNS) {
    local_108._M_impl._M_node.super__List_node_base._M_next =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_108._M_impl._M_node.super__List_node_base._M_prev =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
    local_108._M_impl._M_node._M_size =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node._M_size;
    p_Var6 = (_List_node_base *)&local_108;
    p_Var7 = (_List_node_base *)&local_108;
    if (collections.
        super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&collections) {
      (collections.
       super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
       ._M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_108;
      (collections.
       super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_108;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node._M_size = 0;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&collections;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&collections;
      p_Var6 = local_108._M_impl._M_node.super__List_node_base._M_next;
      p_Var7 = local_108._M_impl._M_node.super__List_node_base._M_prev;
    }
    local_108._M_impl._M_node.super__List_node_base._M_prev = p_Var7;
    local_108._M_impl._M_node.super__List_node_base._M_next = p_Var6;
    PivotCollections((list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                      *)&column_count_str,this,context,
                     (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                      *)&local_108,&column_names,&result_types,uVar10);
    std::__cxx11::list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
    ::_M_move_assign(&collections,&column_count_str);
    std::__cxx11::
    _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::
    _M_clear((_List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
              *)&column_count_str);
    std::__cxx11::
    _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::
    _M_clear(&local_108);
  }
  min_width = 0;
  if (uVar15 <= uVar10 - 1) {
    min_width = sVar14 + 4;
  }
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ComputeRenderWidths(&widths,this,&column_names,&result_types,&collections,min_width,iVar13,
                      &column_map,&total_length);
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (uVar15 = 0;
      uVar15 < (ulong)((long)widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1) {
    if (uVar15 == 0) {
      pvVar11 = vector<unsigned_long,_true>::get<true>(&widths,0);
      column_count_str._M_dataplus._M_p = (pointer)(*pvVar11 + 2);
    }
    else {
      pvVar11 = vector<unsigned_long,_true>::get<true>(&boundaries,uVar15 - 1);
      vVar3 = *pvVar11;
      pvVar11 = vector<unsigned_long,_true>::get<true>(&widths,uVar15);
      column_count_str._M_dataplus._M_p = (pointer)(*pvVar11 + vVar3 + 3);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&boundaries,
               (value_type_conflict1 *)&column_count_str);
  }
  RenderHeader(this,&column_names,&result_types,&column_map,&widths,&boundaries,total_length,
               uVar10 != 0,ss);
  RenderValues(this,&collections,&column_map,&widths,&result_types,ss);
  ::std::__cxx11::to_string
            (&local_200,
             ((long)(result->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(result->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  ::std::operator+(&column_count_str,&local_200," column");
  ::std::__cxx11::string::~string((string *)&local_200);
  puVar5 = column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(result->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(result->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    ::std::__cxx11::string::append((char *)&column_count_str);
    puVar5 = column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  do {
    puVar12 = puVar5;
    puVar4 = column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar12 ==
        column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    puVar5 = puVar12 + 1;
  } while (*puVar12 != 0xffffffffffffffff);
  iVar13 = (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if ((this->config).render_mode == COLUMNS) {
    if (puVar12 !=
        column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ::std::__cxx11::to_string(&local_c8,iVar13 - 3);
      ::std::operator+(&local_160," (",&local_c8);
      ::std::operator+(&local_200,&local_160," shown)");
      ::std::__cxx11::string::operator=((string *)&shown_str,(string *)&local_200);
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::~string((string *)&local_c8);
      local_221 = true;
      goto LAB_0133e098;
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    this_01 = &local_200;
    ::std::__cxx11::string::operator=((string *)&shown_str,(string *)this_01);
  }
  else {
    if (puVar12 ==
        column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0133e098;
    iVar13 = iVar13 - 1;
    ::std::__cxx11::to_string(&local_c8,iVar13);
    ::std::operator+(&local_160," (",&local_c8);
    ::std::operator+(&local_200,&local_160," shown)");
    ::std::__cxx11::string::append((string *)&column_count_str);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_160);
    this_01 = &local_c8;
  }
  ::std::__cxx11::string::~string((string *)this_01);
LAB_0133e098:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)row_count_str._M_dataplus._M_p == &row_count_str.field_2) {
    local_88.field_2._8_8_ = row_count_str.field_2._8_8_;
  }
  else {
    local_88._M_dataplus._M_p = row_count_str._M_dataplus._M_p;
  }
  local_88._M_string_length = row_count_str._M_string_length;
  row_count_str._M_string_length = 0;
  row_count_str.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p == paVar1) {
    local_50.field_2._8_8_ = shown_str.field_2._8_8_;
  }
  else {
    local_50._M_dataplus._M_p = shown_str._M_dataplus._M_p;
  }
  local_50.field_2._M_allocated_capacity._1_7_ = shown_str.field_2._M_allocated_capacity._1_7_;
  local_50.field_2._M_local_buf[0] = shown_str.field_2._M_local_buf[0];
  local_50._M_string_length = shown_str._M_string_length;
  shown_str._M_string_length = 0;
  shown_str.field_2._M_local_buf[0] = '\0';
  shown_str._M_dataplus._M_p = (pointer)paVar1;
  row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
  RenderRowCount(this,&local_88,&local_50,&column_count_str,&boundaries,local_221,puVar12 != puVar4,
                 total_length,uVar10,iVar13,sVar14 + 4,ss);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&column_count_str);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&boundaries);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&widths);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_map);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&column_names);
  std::__cxx11::
  _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::_M_clear
            (&collections.
              super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
            );
  ::std::__cxx11::string::~string((string *)&shown_str);
  ::std::__cxx11::string::~string((string *)&row_count_str);
  return;
}

Assistant:

void BoxRenderer::Render(ClientContext &context, const vector<string> &names, const ColumnDataCollection &result,
                         BaseResultRenderer &ss) {
	if (result.ColumnCount() != names.size()) {
		throw InternalException("Error in BoxRenderer::Render - unaligned columns and names");
	}
	auto max_width = config.max_width;
	if (max_width == 0) {
		if (Printer::IsTerminal(OutputStream::STREAM_STDOUT)) {
			max_width = Printer::TerminalWidth();
		} else {
			max_width = 120;
		}
	}
	// we do not support max widths under 80
	max_width = MaxValue<idx_t>(80, max_width);

	// figure out how many/which rows to render
	idx_t row_count = result.Count();
	idx_t rows_to_render = MinValue<idx_t>(row_count, config.max_rows);
	if (row_count <= config.max_rows + 3) {
		// hiding rows adds 3 extra rows
		// so hiding rows makes no sense if we are only slightly over the limit
		// if we are 1 row over the limit hiding rows will actually increase the number of lines we display!
		// in this case render all the rows
		rows_to_render = row_count;
	}
	idx_t top_rows;
	idx_t bottom_rows;
	if (rows_to_render == row_count) {
		top_rows = row_count;
		bottom_rows = 0;
	} else {
		top_rows = rows_to_render / 2 + (rows_to_render % 2 != 0 ? 1 : 0);
		bottom_rows = rows_to_render - top_rows;
	}
	auto row_count_str = to_string(row_count) + " rows";
	bool has_limited_rows = config.limit > 0 && row_count == config.limit;
	if (has_limited_rows) {
		row_count_str = "? rows";
	}
	string shown_str;
	bool has_hidden_rows = top_rows < row_count;
	if (has_hidden_rows) {
		shown_str = "(";
		if (has_limited_rows) {
			shown_str += ">" + to_string(config.limit - 1) + " rows, ";
		}
		shown_str += to_string(top_rows + bottom_rows) + " shown)";
	}
	auto minimum_row_length = MaxValue<idx_t>(row_count_str.size(), shown_str.size()) + 4;

	// fetch the top and bottom render collections from the result
	auto collections = FetchRenderCollections(context, result, top_rows, bottom_rows);
	auto column_names = names;
	auto result_types = result.Types();
	if (config.render_mode == RenderMode::COLUMNS) {
		collections = PivotCollections(context, std::move(collections), column_names, result_types, row_count);
	}

	// for each column, figure out the width
	// start off by figuring out the name of the header by looking at the column name and column type
	idx_t min_width = has_hidden_rows || row_count == 0 ? minimum_row_length : 0;
	vector<idx_t> column_map;
	idx_t total_length;
	auto widths =
	    ComputeRenderWidths(column_names, result_types, collections, min_width, max_width, column_map, total_length);

	// render boundaries for the individual columns
	vector<idx_t> boundaries;
	for (idx_t c = 0; c < widths.size(); c++) {
		idx_t render_boundary;
		if (c == 0) {
			render_boundary = widths[c] + 2;
		} else {
			render_boundary = boundaries[c - 1] + widths[c] + 3;
		}
		boundaries.push_back(render_boundary);
	}

	// now begin rendering
	// first render the header
	RenderHeader(column_names, result_types, column_map, widths, boundaries, total_length, row_count > 0, ss);

	// render the values, if there are any
	RenderValues(collections, column_map, widths, result_types, ss);

	// render the row count and column count
	auto column_count_str = to_string(result.ColumnCount()) + " column";
	if (result.ColumnCount() > 1) {
		column_count_str += "s";
	}
	bool has_hidden_columns = false;
	for (auto entry : column_map) {
		if (entry == SPLIT_COLUMN) {
			has_hidden_columns = true;
			break;
		}
	}
	idx_t column_count = column_map.size();
	if (config.render_mode == RenderMode::COLUMNS) {
		if (has_hidden_columns) {
			has_hidden_rows = true;
			shown_str = " (" + to_string(column_count - 3) + " shown)";
		} else {
			shown_str = string();
		}
	} else {
		if (has_hidden_columns) {
			column_count--;
			column_count_str += " (" + to_string(column_count) + " shown)";
		}
	}

	RenderRowCount(std::move(row_count_str), std::move(shown_str), column_count_str, boundaries, has_hidden_rows,
	               has_hidden_columns, total_length, row_count, column_count, minimum_row_length, ss);
}